

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::OneofDescriptorProto::Serialize(OneofDescriptorProto *this,Message *msg)

{
  _Head_base<0UL,_perfetto::protos::gen::OneofOptions_*,_false> this_00;
  uint8_t *src_begin;
  ulong uVar1;
  Message *msg_00;
  
  uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 2) != 0) {
    protozero::Message::AppendString(msg,1,&this->name_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 4) != 0) {
    this_00._M_head_impl =
         (this->options_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::OneofOptions,_std::default_delete<perfetto::protos::gen::OneofOptions>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::OneofOptions_*,_std::default_delete<perfetto::protos::gen::OneofOptions>_>
         .super__Head_base<0UL,_perfetto::protos::gen::OneofOptions_*,_false>._M_head_impl;
    msg_00 = protozero::Message::BeginNestedMessageInternal(msg,2);
    OneofOptions::Serialize(this_00._M_head_impl,msg_00);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void OneofDescriptorProto::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 2: options
  if (_has_field_[2]) {
    (*options_).Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}